

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

vec2 __thiscall djb::tab::h2_to_u2_std(tab *this,vec3 *wm,vec3 *wi)

{
  vec2 vVar1;
  float fVar2;
  float u1;
  float fVar3;
  vec3 local_50;
  vec2 local_40;
  float local_38;
  float_t fStack_34;
  float_t fStack_30;
  float_t fStack_2c;
  float_t local_28;
  
  local_50.z = wi->z;
  local_50.x = wi->x;
  local_50.y = wi->y;
  fVar3 = wm->z;
  fVar2 = 0.0;
  if (fVar3 < 1.0) {
    fVar2 = atan2f(wm->y,wm->x);
  }
  u1 = (fVar2 / 3.1415927 + 1.0) * 0.5;
  fVar2 = 0.0;
  if (0.0 <= fVar3) {
    fVar2 = fVar3;
  }
  fVar3 = 1.0;
  if (fVar2 <= 1.0) {
    fVar3 = fVar2;
  }
  fVar3 = acosf(fVar3);
  fVar3 = fVar3 * 0.63661975;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  local_28 = cdf1(this,u1,&local_50);
  local_40.y = 1.0;
  local_40.x = u1;
  vVar1 = cdfv(this,&local_40,&local_50);
  local_38 = vVar1.y;
  local_40.x = u1;
  local_40.y = fVar3;
  fStack_34 = local_38;
  fStack_30 = local_38;
  fStack_2c = local_38;
  vVar1 = cdfv(this,&local_40,&local_50);
  vVar1.y = vVar1.y / local_38;
  vVar1.x = local_28;
  return vVar1;
}

Assistant:

vec2 tab::h2_to_u2_std(const vec3 &wm, const vec3 &wi) const
{
	int s = 1;//wi.y > 0 ? 1 : -1; // exploit the azimuthal symmetry of the BRDF
	vec3 wi_std = vec3(s * wi.x, s * wi.y, wi.z);
	vec3 wm_std = vec3(s * wm.x, s * wm.y, wm.z);
	float_t pm = wm_std.z < 1 ? atan2(wm_std.y, wm_std.x) : 0;
	float_t u1 = (pm / m_pi() + 1) / 2;
	float_t u2 = sqrt(acos(sat(wm_std.z)) * (2 / m_pi()));

	return vec2(cdf1(u1, wi_std), cdf2(u2, u1, wi_std));
}